

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O0

void __thiscall NaConfigFile::~NaConfigFile(NaConfigFile *this)

{
  undefined8 *in_RDI;
  NaDataStream *this_00;
  
  *in_RDI = &PTR__NaConfigFile_00193f40;
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  this_00 = (NaDataStream *)in_RDI[4];
  if (this_00 != (NaDataStream *)0x0) {
    operator_delete__(this_00);
  }
  if ((void *)in_RDI[5] != (void *)0x0) {
    operator_delete__((void *)in_RDI[5]);
  }
  NaDynAr<NaCPRegItem>::~NaDynAr((NaDynAr<NaCPRegItem> *)0x138672);
  NaDataStream::~NaDataStream(this_00);
  return;
}

Assistant:

NaConfigFile::~NaConfigFile ()
{
    delete[] szMagicString;
    delete[] szFileExtString;
    delete[] szMarksBuf;
}